

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O0

void skiwi::compile_less_2(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t lab;
  uint64_t lab_00;
  uint64_t lab_01;
  uint64_t lab_02;
  uint64_t lab_03;
  operation local_2f8 [2];
  operand local_2f0 [2];
  operation local_2e8 [2];
  operand local_2e0 [2];
  operation local_2d8 [2];
  operand local_2d0 [2];
  operation local_2c8 [3];
  operand local_2bc [2];
  operation local_2b4;
  operand local_2b0 [2];
  operation local_2a8;
  operand local_2a4 [2];
  operation local_29c [2];
  operand local_294 [2];
  operation local_28c;
  operand local_288;
  operation local_284;
  unsigned_long local_280;
  operand local_274 [2];
  operation local_26c;
  operand local_268;
  operation local_264 [3];
  operand local_258 [2];
  operation local_250;
  operand local_24c;
  operation local_248;
  operand local_244 [2];
  operation local_23c [4];
  operand local_22c [2];
  operation local_224;
  operand local_220 [2];
  operation local_218;
  operand local_214 [2];
  operation local_20c [2];
  operand local_204 [2];
  operation local_1fc;
  operand local_1f8;
  operation local_1f4;
  unsigned_long local_1f0;
  operand local_1e8 [2];
  operation local_1e0;
  operand local_1dc;
  operation local_1d8;
  operand local_1d4 [2];
  operation local_1cc [3];
  operand local_1c0 [2];
  operation local_1b8 [5];
  operand local_1a4 [2];
  operation local_19c;
  operand local_198 [2];
  operation local_190;
  operand local_18c [2];
  operation local_184 [2];
  operand local_17c [2];
  operation local_174 [2];
  operand local_16c [2];
  operation local_164;
  operand local_160;
  operation local_15c;
  unsigned_long local_158;
  operand local_14c [2];
  operation local_144;
  unsigned_long local_140;
  operand local_134 [2];
  operation local_12c;
  operand local_128;
  operation local_124 [4];
  operand local_114 [2];
  operation local_10c [4];
  operand local_fc [2];
  operation local_f4;
  string local_f0;
  undefined1 local_d0 [8];
  string error;
  string done;
  string l3;
  undefined1 local_60 [8];
  string l2;
  string l1;
  compiler_options *ops_local;
  asmcode *code_local;
  
  l1.field_2._12_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,char_const(&)[9]>
            (code,(operation *)(l1.field_2._M_local_buf + 0xc),(char (*) [9])"L_less_2");
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)((long)&l2.field_2 + 8),psVar1,lab);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)local_60,psVar1,lab_00);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)((long)&done.field_2 + 8),psVar1,lab_01);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_((string *)((long)&error.field_2 + 8),psVar1,lab_02);
  std::__cxx11::string::string((string *)local_d0);
  psVar1 = label;
  if ((ops->safe_primitives & 1U) != 0) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_f0,psVar1,lab_03);
    std::__cxx11::string::operator=((string *)local_d0,(string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
  }
  local_f4 = TEST;
  local_fc[1] = 9;
  local_fc[0] = NUMBER;
  local_10c[3] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_f4,local_fc + 1,local_fc,(int *)(local_10c + 3));
  if ((ops->safe_primitives & 1U) == 0) {
    local_10c[1] = 0x38;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_10c + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&l2.field_2 + 8));
  }
  else {
    local_10c[2] = 0x2f;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_10c + 2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&l2.field_2 + 8));
  }
  local_10c[0] = TEST;
  local_114[1] = 10;
  local_114[0] = NUMBER;
  local_124[3] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_10c,local_114 + 1,local_114,(int *)(local_124 + 3));
  if ((ops->safe_primitives & 1U) == 0) {
    local_124[1] = 0x38;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_124 + 1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&done.field_2 + 8));
  }
  else {
    local_124[2] = 0x2f;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_124 + 2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&done.field_2 + 8));
  }
  if ((ops->safe_primitives & 1U) != 0) {
    local_124[0] = PUSH;
    local_128 = R11;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,local_124,&local_128);
    jump_if_arg_is_not_block(code,RAX,R11,(string *)local_d0);
    jump_if_arg_is_not_block(code,RBX,R11,(string *)local_d0);
  }
  local_12c = AND;
  local_134[1] = 9;
  local_134[0] = NUMBER;
  local_140 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_12c,local_134 + 1,local_134,&local_140);
  local_144 = AND;
  local_14c[1] = 10;
  local_14c[0] = NUMBER;
  local_158 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_144,local_14c + 1,local_14c,&local_158);
  if ((ops->safe_primitives & 1U) != 0) {
    jump_if_arg_does_not_point_to_flonum(code,RAX,R11,(string *)local_d0);
    jump_if_arg_does_not_point_to_flonum(code,RBX,R11,(string *)local_d0);
    local_15c = POP;
    local_160 = R11;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,&local_15c,&local_160);
  }
  local_164 = MOVSD;
  local_16c[1] = 0x43;
  local_16c[0] = MEM_RAX;
  local_174[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_164,local_16c + 1,local_16c,(int *)(local_174 + 1));
  local_174[0] = MOVSD;
  local_17c[1] = 0x44;
  local_17c[0] = MEM_RBX;
  local_184[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_174,local_17c + 1,local_17c,(int *)(local_184 + 1));
  local_184[0] = CMPLTPD;
  local_18c[1] = 0x43;
  local_18c[0] = XMM1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_184,local_18c + 1,local_18c);
  local_190 = MOVMSKPD;
  local_198[1] = 9;
  local_198[0] = XMM0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_190,local_198 + 1,local_198);
  local_19c = OR;
  local_1a4[1] = 10;
  local_1a4[0] = NUMBER;
  local_1b8[4] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_19c,local_1a4 + 1,local_1a4,(int *)(local_1b8 + 4));
  if ((ops->safe_primitives & 1U) == 0) {
    local_1b8[2] = 0x35;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_1b8 + 2,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&error.field_2 + 8));
  }
  else {
    local_1b8[3] = 0x2c;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,local_1b8 + 3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&error.field_2 + 8));
  }
  local_1b8[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_1b8 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&l2.field_2 + 8));
  local_1b8[0] = TEST;
  local_1c0[1] = 10;
  local_1c0[0] = NUMBER;
  local_1cc[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_1b8,local_1c0 + 1,local_1c0,(int *)(local_1cc + 2));
  local_1cc[1] = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_1cc + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  fix2int(code,RAX);
  local_1cc[0] = CVTSI2SD;
  local_1d4[1] = 0x43;
  local_1d4[0] = RAX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_1cc,local_1d4 + 1,local_1d4);
  if ((ops->safe_primitives & 1U) != 0) {
    local_1d8 = PUSH;
    local_1dc = R11;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,&local_1d8,&local_1dc);
    jump_if_arg_is_not_block(code,RBX,R11,(string *)local_d0);
  }
  local_1e0 = AND;
  local_1e8[1] = 10;
  local_1e8[0] = NUMBER;
  local_1f0 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_1e0,local_1e8 + 1,local_1e8,&local_1f0);
  if ((ops->safe_primitives & 1U) != 0) {
    jump_if_arg_does_not_point_to_flonum(code,RBX,R11,(string *)local_d0);
    local_1f4 = POP;
    local_1f8 = R11;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,&local_1f4,&local_1f8);
  }
  local_1fc = MOVSD;
  local_204[1] = 0x44;
  local_204[0] = MEM_RBX;
  local_20c[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_1fc,local_204 + 1,local_204,(int *)(local_20c + 1));
  local_20c[0] = CMPLTPD;
  local_214[1] = 0x43;
  local_214[0] = XMM1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_20c,local_214 + 1,local_214);
  local_218 = MOVMSKPD;
  local_220[1] = 9;
  local_220[0] = XMM0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_218,local_220 + 1,local_220);
  local_224 = OR;
  local_22c[1] = 10;
  local_22c[0] = NUMBER;
  local_23c[3] = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_224,local_22c + 1,local_22c,(int *)(local_23c + 3));
  local_23c[2] = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_23c + 2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&error.field_2 + 8));
  local_23c[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_23c + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60);
  local_23c[0] = CMP;
  local_244[1] = 9;
  local_244[0] = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_23c,local_244 + 1,local_244);
  local_248 = SETL;
  local_24c = AL;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,&local_248,&local_24c);
  local_250 = MOVZX;
  local_258[1] = 9;
  local_258[0] = AL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_250,local_258 + 1,local_258);
  local_264[2] = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_264 + 2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&error.field_2 + 8));
  local_264[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_264 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&done.field_2 + 8));
  if ((ops->safe_primitives & 1U) != 0) {
    local_264[0] = PUSH;
    local_268 = R11;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,local_264,&local_268);
    jump_short_if_arg_is_not_block(code,RAX,R11,(string *)local_d0);
  }
  local_26c = AND;
  local_274[1] = 9;
  local_274[0] = NUMBER;
  local_280 = 0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_26c,local_274 + 1,local_274,&local_280);
  if ((ops->safe_primitives & 1U) != 0) {
    jump_short_if_arg_does_not_point_to_flonum(code,RAX,R11,(string *)local_d0);
    local_284 = POP;
    local_288 = R11;
    assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
              (code,&local_284,&local_288);
  }
  local_28c = MOVSD;
  local_294[1] = 0x43;
  local_294[0] = MEM_RAX;
  local_29c[1] = 8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,&local_28c,local_294 + 1,local_294,(int *)(local_29c + 1));
  fix2int(code,RBX);
  local_29c[0] = CVTSI2SD;
  local_2a4[1] = 0x44;
  local_2a4[0] = RBX;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_29c,local_2a4 + 1,local_2a4);
  int2fix(code,RBX);
  local_2a8 = CMPLTPD;
  local_2b0[1] = 0x43;
  local_2b0[0] = XMM1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_2a8,local_2b0 + 1,local_2b0);
  local_2b4 = MOVMSKPD;
  local_2bc[1] = 9;
  local_2bc[0] = XMM0;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,&local_2b4,local_2bc + 1,local_2bc);
  local_2c8[2] = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_2c8 + 2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&error.field_2 + 8));
  local_2c8[1] = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_2c8 + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&error.field_2 + 8));
  local_2c8[0] = AND;
  local_2d0[1] = 9;
  local_2d0[0] = NUMBER;
  local_2d8[1] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_2c8,local_2d0 + 1,local_2d0,(int *)(local_2d8 + 1));
  local_2d8[0] = SHL;
  local_2e0[1] = 9;
  local_2e0[0] = NUMBER;
  local_2e8[1] = 3;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_2d8,local_2e0 + 1,local_2e0,(int *)(local_2e8 + 1));
  local_2e8[0] = OR;
  local_2f0[1] = 9;
  local_2f0[0] = NUMBER;
  local_2f8[1] = 7;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_2e8,local_2f0 + 1,local_2f0,(int *)(local_2f8 + 1));
  local_2f8[0] = RET;
  assembler::asmcode::add<assembler::asmcode::operation>(code,local_2f8);
  if ((ops->safe_primitives & 1U) != 0) {
    error_label(code,(string *)local_d0,re_less_contract_violation);
  }
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)(error.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(done.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(l2.field_2._M_local_buf + 8));
  return;
}

Assistant:

void compile_less_2(asmcode& code, const compiler_options& ops)
  {
  code.add(asmcode::LABEL, "L_less_2");
  auto l1 = label_to_string(label++);
  auto l2 = label_to_string(label++);
  auto l3 = label_to_string(label++);
  auto done = label_to_string(label++);
  std::string error;
  if (ops.safe_primitives)
    error = label_to_string(label++);
  code.add(asmcode::TEST, asmcode::RAX, asmcode::NUMBER, 1);
  if (ops.safe_primitives)
    code.add(asmcode::JE, l1);
  else
    code.add(asmcode::JES, l1); // rax is fixnum
  //rax is flonum
  code.add(asmcode::TEST, asmcode::RBX, asmcode::NUMBER, 1);
  if (ops.safe_primitives)
    code.add(asmcode::JE, l3); // rax is flonum and rbx is fixnum
  else
    code.add(asmcode::JES, l3); // rax is flonum and rbx is fixnum
  // rax and rbx are flonum
  // here check whether they are a block
  if (ops.safe_primitives)
    {
    code.add(asmcode::PUSH, asmcode::R11);
    jump_if_arg_is_not_block(code, asmcode::RAX, asmcode::R11, error);
    jump_if_arg_is_not_block(code, asmcode::RBX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RAX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  code.add(asmcode::AND, asmcode::RBX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  // check whether they contain flonums
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_flonum(code, asmcode::RAX, asmcode::R11, error);
    jump_if_arg_does_not_point_to_flonum(code, asmcode::RBX, asmcode::R11, error);
    code.add(asmcode::POP, asmcode::R11);
    }
  code.add(asmcode::MOVSD, asmcode::XMM0, asmcode::MEM_RAX, CELLS(1));
  code.add(asmcode::MOVSD, asmcode::XMM1, asmcode::MEM_RBX, CELLS(1));
  code.add(asmcode::CMPLTPD, asmcode::XMM0, asmcode::XMM1);
  code.add(asmcode::MOVMSKPD, asmcode::RAX, asmcode::XMM0);
  code.add(asmcode::OR, asmcode::RBX, asmcode::NUMBER, block_tag);
  if (ops.safe_primitives)
    code.add(asmcode::JMP, done);
  else
    code.add(asmcode::JMPS, done);
  code.add(asmcode::LABEL, l1);
  code.add(asmcode::TEST, asmcode::RBX, asmcode::NUMBER, 1);
  code.add(asmcode::JES, l2); // rax and rbx are fixnum
  // rax is fixnum and rbx is flonum
  fix2int(code, asmcode::RAX);
  code.add(asmcode::CVTSI2SD, asmcode::XMM0, asmcode::RAX);
  // here check whether RBX is a block
  if (ops.safe_primitives)
    {
    code.add(asmcode::PUSH, asmcode::R11);
    jump_if_arg_is_not_block(code, asmcode::RBX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RBX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_if_arg_does_not_point_to_flonum(code, asmcode::RBX, asmcode::R11, error);
    code.add(asmcode::POP, asmcode::R11);
    }
  code.add(asmcode::MOVSD, asmcode::XMM1, asmcode::MEM_RBX, CELLS(1));
  code.add(asmcode::CMPLTPD, asmcode::XMM0, asmcode::XMM1);
  code.add(asmcode::MOVMSKPD, asmcode::RAX, asmcode::XMM0);
  code.add(asmcode::OR, asmcode::RBX, asmcode::NUMBER, block_tag);
  code.add(asmcode::JMPS, done);
  code.add(asmcode::LABEL, l2);
  code.add(asmcode::CMP, asmcode::RAX, asmcode::RBX);
  code.add(asmcode::SETL, asmcode::AL);
  code.add(asmcode::MOVZX, asmcode::RAX, asmcode::AL);
  code.add(asmcode::JMPS, done);

  code.add(asmcode::LABEL, l3);
  // rax is flonum and rbx is fixnum
  // here check whether RAX is a block
  if (ops.safe_primitives)
    {
    code.add(asmcode::PUSH, asmcode::R11);
    jump_short_if_arg_is_not_block(code, asmcode::RAX, asmcode::R11, error);
    }
  code.add(asmcode::AND, asmcode::RAX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    {
    jump_short_if_arg_does_not_point_to_flonum(code, asmcode::RAX, asmcode::R11, error);
    code.add(asmcode::POP, asmcode::R11);
    }
  code.add(asmcode::MOVSD, asmcode::XMM0, asmcode::MEM_RAX, CELLS(1));
  fix2int(code, asmcode::RBX);
  code.add(asmcode::CVTSI2SD, asmcode::XMM1, asmcode::RBX);
  int2fix(code, asmcode::RBX);
  code.add(asmcode::CMPLTPD, asmcode::XMM0, asmcode::XMM1);
  code.add(asmcode::MOVMSKPD, asmcode::RAX, asmcode::XMM0);
  code.add(asmcode::JMPS, done);
  code.add(asmcode::LABEL, done);
  code.add(asmcode::AND, asmcode::RAX, asmcode::NUMBER, 1);
  code.add(asmcode::SHL, asmcode::RAX, asmcode::NUMBER, 3);
  code.add(asmcode::OR, asmcode::RAX, asmcode::NUMBER, bool_f);
  code.add(asmcode::RET);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_less_contract_violation);
    }
  }